

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  undefined1 auVar8 [16];
  type_conflict5 tVar9;
  double *pdVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  bool bVar13;
  Real val_00;
  ulong uVar14;
  cpp_dec_float<50U,_int,_void> local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  
  local_1f8._48_8_ = local_1f8._48_8_ & 0xffffffff00000000;
  local_1f8.data._M_elems[0] = 0;
  local_1f8.data._M_elems[1] = 0;
  local_1f8.data._M_elems[2] = 0;
  local_1f8.data._M_elems[3] = 0;
  local_1f8.data._M_elems[4] = 0;
  local_1f8.data._M_elems[5] = 0;
  local_1f8.data._M_elems[6] = 0;
  local_1f8.data._M_elems[7] = 0;
  local_1f8.data._M_elems[8] = 0;
  local_1f8.data._M_elems[9] = 0;
  local_1f8.exp = 0;
  local_1f8.neg = false;
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_140 = (cpp_dec_float<50U,_int,_void> *)this;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val_00 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val_00,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result_2.m_backend.data._M_elems + 2));
  local_138.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_138.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_138.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_138.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_138.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_138.m_backend.exp = (val->m_backend).exp;
  local_138.m_backend.neg = (val->m_backend).neg;
  local_138.m_backend.fpclass = (val->m_backend).fpclass;
  local_138.m_backend.prec_elem = (val->m_backend).prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_178,0);
  local_140 = &(((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&local_140->data)->delta).m_backend;
  lVar11 = (long)num;
LAB_00274d71:
  do {
    bVar13 = lVar11 == 0;
    lVar11 = lVar11 + -1;
    if (bVar13) {
      *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_138.m_backend.data._M_elems._32_8_
      ;
      *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_138.m_backend.data._M_elems._16_8_
      ;
      *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_138.m_backend.data._M_elems._24_8_
      ;
      *(undefined8 *)(val->m_backend).data._M_elems = local_138.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_138.m_backend.data._M_elems._8_8_;
      (val->m_backend).exp = local_138.m_backend.exp;
      (val->m_backend).neg = local_138.m_backend.neg;
      (val->m_backend).fpclass = local_138.m_backend.fpclass;
      (val->m_backend).prec_elem = local_138.m_backend.prec_elem;
      return -1;
    }
    iVar2 = idx[lVar11];
    uVar3 = *(undefined8 *)(upd[iVar2].m_backend.data._M_elems + 8);
    local_1f8.data._M_elems[8] = (uint)uVar3;
    local_1f8.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)upd[iVar2].m_backend.data._M_elems;
    uVar4 = *(undefined8 *)(upd[iVar2].m_backend.data._M_elems + 2);
    puVar1 = upd[iVar2].m_backend.data._M_elems + 4;
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_1f8.data._M_elems[4] = (uint)uVar5;
    local_1f8.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
    local_1f8.data._M_elems[6] = (uint)uVar6;
    local_1f8.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
    local_1f8.data._M_elems[0] = (uint)uVar3;
    local_1f8.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
    local_1f8.data._M_elems[2] = (uint)uVar4;
    local_1f8.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
    local_1f8.exp = upd[iVar2].m_backend.exp;
    local_1f8.neg = upd[iVar2].m_backend.neg;
    local_1f8.fpclass = upd[iVar2].m_backend.fpclass;
    local_1f8.prec_elem = upd[iVar2].m_backend.prec_elem;
    tVar9 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,&epsilon);
    if (!tVar9) goto LAB_00274fc8;
    tVar9 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_178);
    pcVar12 = &local_178;
    if (tVar9) {
      pcVar12 = &local_1f8;
    }
    uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
    local_178.data._M_elems[8] = (uint)uVar3;
    local_178.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(pcVar12->data)._M_elems;
    uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 2);
    uVar5 = *(undefined8 *)((pcVar12->data)._M_elems + 4);
    uVar6 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
    local_178.data._M_elems[4] = (uint)uVar5;
    local_178.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
    local_178.data._M_elems[6] = (uint)uVar6;
    local_178.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
    local_178.data._M_elems[0] = (uint)uVar3;
    local_178.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
    local_178.data._M_elems[2] = (uint)uVar4;
    local_178.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
    pcVar12 = &local_178;
    if (tVar9) {
      pcVar12 = &local_1f8;
    }
    pcVar7 = &local_178;
    if (tVar9) {
      pcVar7 = &local_1f8;
    }
    local_178.exp = pcVar12->exp;
    local_178.neg = pcVar7->neg;
    uVar14 = CONCAT44((int)((uint)tVar9 << 0x1f) >> 0x1f,(int)((uint)tVar9 << 0x1f) >> 0x1f);
    local_178._48_8_ = ~uVar14 & local_178._48_8_ | local_1f8._48_8_ & uVar14;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&low[iVar2].m_backend,&vec[iVar2].m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9]._0_1_ = 0;
    result_1.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_1.m_backend,&result.m_backend,local_140);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_2.m_backend,&result_1.m_backend,&local_1f8);
    local_1f8.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
    local_1f8.data._M_elems[9] =
         (uint)(CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                         result_2.m_backend.data._M_elems._32_5_) >> 0x20);
    local_1f8.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    local_1f8.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    local_1f8.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
    local_1f8.data._M_elems[7] =
         (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                         result_2.m_backend.data._M_elems._24_5_) >> 0x20);
    local_1f8.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    local_1f8.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    local_1f8.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    local_1f8.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    local_1f8.exp = result_2.m_backend.exp;
    local_1f8.neg = result_2.m_backend.neg;
    local_1f8.fpclass = result_2.m_backend.fpclass;
    local_1f8.prec_elem = result_2.m_backend.prec_elem;
    tVar9 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,&local_138);
  } while (!tVar9);
  pdVar10 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&result_2.m_backend,-*pdVar10,(type *)0x0);
  tVar9 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&low[iVar2].m_backend,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result_2.m_backend);
  goto LAB_0027528e;
LAB_00274fc8:
  result_2.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
  result_2.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
  result_2.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  result_2.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
  auVar8 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
  result_2.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
  result_2.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
  result_2.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
  result_2.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
  result_2.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
  result_2.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
  result_2.m_backend.exp = epsilon.m_backend.exp;
  result_2.m_backend.neg = epsilon.m_backend.neg;
  result_2.m_backend.fpclass = epsilon.m_backend.fpclass;
  result_2.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  result_2.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  if (epsilon.m_backend.fpclass != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)
  {
    result_2.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  result_2.m_backend.data._M_elems._0_16_ = auVar8;
  tVar9 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1f8,&result_2);
  if (tVar9) {
    result_2.m_backend.data._M_elems[1] = local_1f8.data._M_elems[1];
    result_2.m_backend.data._M_elems[0] = local_1f8.data._M_elems[0];
    result_2.m_backend.data._M_elems[3] = local_1f8.data._M_elems[3];
    result_2.m_backend.data._M_elems[2] = local_1f8.data._M_elems[2];
    result_2.m_backend.data._M_elems[5] = local_1f8.data._M_elems[5];
    result_2.m_backend.data._M_elems[4] = local_1f8.data._M_elems[4];
    result_2.m_backend.data._M_elems._32_5_ =
         SUB85(CONCAT44(local_1f8.data._M_elems[9],local_1f8.data._M_elems[8]),0);
    result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_1f8.data._M_elems[9] >> 8);
    result_2.m_backend.data._M_elems._24_5_ =
         SUB85(CONCAT44(local_1f8.data._M_elems[7],local_1f8.data._M_elems[6]),0);
    result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_1f8.data._M_elems[7] >> 8);
    result_2.m_backend.exp = local_1f8.exp;
    result_2.m_backend.neg = local_1f8.neg;
    result_2.m_backend.fpclass = local_1f8.fpclass;
    result_2.m_backend.prec_elem = local_1f8.prec_elem;
    if (local_1f8.fpclass != 0 || local_1f8.data._M_elems[0] != 0) {
      result_2.m_backend.neg = (bool)(local_1f8.neg ^ 1);
    }
    tVar9 = boost::multiprecision::operator>
                      (&result_2,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_178);
    if (tVar9) {
      result_1.m_backend.data._M_elems[0] = local_1f8.data._M_elems[1];
      result_1.m_backend.data._M_elems[1] = local_1f8.data._M_elems[2];
      result_1.m_backend.data._M_elems[2] = local_1f8.data._M_elems[3];
      result_1.m_backend.data._M_elems[3] = local_1f8.data._M_elems[4];
      result_1.m_backend.data._M_elems[4] = local_1f8.data._M_elems[5];
      result_1.m_backend.data._M_elems[5] = local_1f8.data._M_elems[6];
      result_1.m_backend.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_1f8.data._M_elems[8],local_1f8.data._M_elems[7]),0);
      result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_1f8.data._M_elems[8] >> 8);
      result_1.m_backend.data._M_elems[8] = local_1f8.data._M_elems[9];
      local_178.exp = local_1f8.exp;
      local_178.prec_elem = local_1f8.prec_elem;
      if (local_1f8.fpclass == cpp_dec_float_finite && local_1f8.data._M_elems[0] == 0) {
        local_178.neg = local_1f8.neg;
        local_178.fpclass = cpp_dec_float_finite;
        local_178.data._M_elems[0] = 0;
      }
      else {
        local_178.neg = (bool)(local_1f8.neg ^ 1);
        local_178.fpclass = local_1f8.fpclass;
        local_178.data._M_elems[0] = local_1f8.data._M_elems[0];
      }
    }
    else {
      result_1.m_backend.data._M_elems[0] = local_178.data._M_elems[1];
      result_1.m_backend.data._M_elems[1] = local_178.data._M_elems[2];
      result_1.m_backend.data._M_elems[2] = local_178.data._M_elems[3];
      result_1.m_backend.data._M_elems[3] = local_178.data._M_elems[4];
      result_1.m_backend.data._M_elems[4] = local_178.data._M_elems[5];
      result_1.m_backend.data._M_elems[5] = local_178.data._M_elems[6];
      result_1.m_backend.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_178.data._M_elems[8],local_178.data._M_elems[7]),0);
      result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_178.data._M_elems[8] >> 8);
      result_1.m_backend.data._M_elems[8] = local_178.data._M_elems[9];
    }
    local_178.data._M_elems[9] = result_1.m_backend.data._M_elems[8];
    local_178.data._M_elems[5] = result_1.m_backend.data._M_elems[4];
    local_178.data._M_elems[6] = result_1.m_backend.data._M_elems[5];
    local_178.data._M_elems[7] = result_1.m_backend.data._M_elems[6];
    local_178.data._M_elems[8] =
         (uint)(CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                         result_1.m_backend.data._M_elems._24_5_) >> 0x20);
    local_178.data._M_elems[1] = result_1.m_backend.data._M_elems[0];
    local_178.data._M_elems[2] = result_1.m_backend.data._M_elems[1];
    local_178.data._M_elems[3] = result_1.m_backend.data._M_elems[2];
    local_178.data._M_elems[4] = result_1.m_backend.data._M_elems[3];
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&up[iVar2].m_backend,&vec[iVar2].m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9]._0_1_ = 0;
    result_1.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_1.m_backend,&result.m_backend,local_140);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_2.m_backend,&result_1.m_backend,&local_1f8);
    local_1f8.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
    local_1f8.data._M_elems[9] =
         (uint)(CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                         result_2.m_backend.data._M_elems._32_5_) >> 0x20);
    local_1f8.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    local_1f8.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    local_1f8.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
    local_1f8.data._M_elems[7] =
         (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                         result_2.m_backend.data._M_elems._24_5_) >> 0x20);
    local_1f8.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    local_1f8.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    local_1f8.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    local_1f8.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    local_1f8.exp = result_2.m_backend.exp;
    local_1f8.neg = result_2.m_backend.neg;
    local_1f8.fpclass = result_2.m_backend.fpclass;
    local_1f8.prec_elem = result_2.m_backend.prec_elem;
    tVar9 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,&local_138);
    if (tVar9) {
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_2.m_backend,*pdVar10,(type *)0x0);
      tVar9 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&up[iVar2].m_backend,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_2.m_backend);
LAB_0027528e:
      if (tVar9 != false) {
        local_138.m_backend.data._M_elems[9] = local_1f8.data._M_elems[9];
        local_138.m_backend.data._M_elems[8] = local_1f8.data._M_elems[8];
        local_138.m_backend.data._M_elems[1] = local_1f8.data._M_elems[1];
        local_138.m_backend.data._M_elems[0] = local_1f8.data._M_elems[0];
        local_138.m_backend.data._M_elems[3] = local_1f8.data._M_elems[3];
        local_138.m_backend.data._M_elems[2] = local_1f8.data._M_elems[2];
        local_138.m_backend.data._M_elems[5] = local_1f8.data._M_elems[5];
        local_138.m_backend.data._M_elems[4] = local_1f8.data._M_elems[4];
        local_138.m_backend.data._M_elems[7] = local_1f8.data._M_elems[7];
        local_138.m_backend.data._M_elems[6] = local_1f8.data._M_elems[6];
        local_138.m_backend.exp = local_1f8.exp;
        local_138.m_backend.neg = local_1f8.neg;
        local_138.m_backend.fpclass = local_1f8.fpclass;
        local_138.m_backend.prec_elem = local_1f8.prec_elem;
      }
    }
  }
  goto LAB_00274d71;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}